

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uchar *puVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int itemsize;
  int iVar11;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  uint uVar13;
  undefined4 in_register_00000034;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  void *pvVar20;
  long lVar21;
  uchar **hash_table [16384];
  int iStack_20088;
  uint uStack_20084;
  uchar *puStack_20080;
  ulong uStack_20078;
  uchar *puStack_20070;
  int iStack_20068;
  int iStack_20064;
  ulong uStack_20060;
  ulong uStack_20058;
  int *piStack_20050;
  size_t sStack_20048;
  ulong uStack_20040;
  void *apvStack_20038 [16385];
  
  uStack_20078 = CONCAT44(in_register_00000034,data_len);
  puStack_20080 = (uchar *)0x0;
  uStack_20060 = 5;
  if (5 < quality) {
    uStack_20060 = (ulong)(uint)quality;
  }
  piStack_20050 = out_len;
  stbiw__sbgrowf(&puStack_20080,1,(int)out_len);
  iVar11 = *(int *)(puStack_20080 + -4);
  *(int *)(puStack_20080 + -4) = iVar11 + 1;
  puStack_20080[iVar11] = 'x';
  iVar18 = *(int *)(puStack_20080 + -4);
  iVar11 = iVar18 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar11) {
    stbiw__sbgrowf(&puStack_20080,1,itemsize);
    iVar18 = *(int *)(puStack_20080 + -4);
    iVar11 = iVar18 + 1;
  }
  *(int *)(puStack_20080 + -4) = iVar11;
  puStack_20080[iVar18] = '^';
  uStack_20084 = 1;
  iStack_20088 = 1;
  puVar6 = stbiw__zlib_flushf(puStack_20080,&uStack_20084,&iStack_20088);
  uStack_20084 = uStack_20084 | 1 << ((byte)iStack_20088 & 0x1f);
  iStack_20088 = iStack_20088 + 2;
  puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
  uVar8 = 0;
  puStack_20080 = puVar6;
  memset(apvStack_20038,0,0x20000);
  iVar11 = (int)uStack_20078;
  if (3 < iVar11) {
    iStack_20064 = iVar11 + -3;
    iStack_20068 = (int)uStack_20060 * 2;
    uStack_20040 = uStack_20060 & 0xffffffff;
    sStack_20048 = uStack_20040 * 8;
    uVar17 = 0;
    uVar12 = extraout_RDX;
    do {
      iVar11 = (int)uVar12;
      iVar18 = (int)uVar17;
      pbVar1 = data + iVar18;
      uVar8 = (uint)CONCAT12(data[(long)iVar18 + 2],*(undefined2 *)(data + iVar18)) * 8 ^
              (uint)CONCAT12(data[(long)iVar18 + 2],*(undefined2 *)(data + iVar18));
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = (uVar8 >> 6) + uVar8 & 0x3fff;
      pvVar20 = apvStack_20038[uVar8];
      puStack_20070 = puVar6;
      uStack_20058 = uVar17;
      if (pvVar20 == (void *)0x0) {
        iVar10 = 3;
        lVar21 = 0;
LAB_001cae81:
        stbiw__sbgrowf(apvStack_20038 + uVar8,8,iVar11);
        pvVar20 = apvStack_20038[uVar8];
        iVar18 = *(int *)((long)pvVar20 + -4);
        iVar9 = iVar18 + 1;
      }
      else {
        if ((long)*(int *)((long)pvVar20 + -4) < 1) {
          iVar10 = 3;
          lVar21 = 0;
        }
        else {
          iVar11 = (int)uStack_20078 - iVar18;
          uVar13 = iVar11 - 1;
          if (0x100 < uVar13) {
            uVar13 = 0x101;
          }
          iVar10 = 3;
          lVar14 = 0;
          lVar21 = 0;
          do {
            lVar3 = *(long *)((long)pvVar20 + lVar14 * 8);
            if ((long)(iVar18 + -0x8000) < lVar3 - (long)data) {
              uVar17 = 0;
              if (0 < iVar11) {
                do {
                  if (*(byte *)(lVar3 + uVar17) != pbVar1[uVar17]) goto LAB_001cae1e;
                  uVar17 = uVar17 + 1;
                } while (uVar13 + 1 != uVar17);
                uVar17 = (ulong)(uVar13 + 1);
              }
LAB_001cae1e:
              iVar16 = (int)uVar17;
              iVar9 = iVar10;
              if (iVar10 < iVar16) {
                iVar9 = iVar16;
              }
              bVar4 = iVar10 <= iVar16;
              iVar10 = iVar9;
              if (bVar4) {
                lVar21 = lVar3;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != *(int *)((long)pvVar20 + -4));
          if (pvVar20 == (void *)0x0) goto LAB_001cae81;
        }
        iVar18 = *(int *)((long)pvVar20 + -4);
        if (iVar18 == iStack_20068) {
          memmove(pvVar20,(void *)(uStack_20040 * 8 + (long)pvVar20),sStack_20048);
          iVar18 = (int)uStack_20060;
          *(int *)((long)pvVar20 + -4) = iVar18;
          iVar11 = extraout_EDX;
        }
        iVar9 = iVar18 + 1;
        if (*(int *)((long)pvVar20 + -8) <= iVar9) goto LAB_001cae81;
      }
      *(int *)((long)pvVar20 + -4) = iVar9;
      *(byte **)((long)pvVar20 + (long)iVar18 * 8) = pbVar1;
      iVar11 = (int)uStack_20078;
      bVar7 = (byte)iStack_20088;
      if (lVar21 == 0) {
LAB_001cafde:
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar8 = bVar2 + 0x30;
          iVar18 = 0;
          iVar10 = -8;
          do {
            iVar18 = (uVar8 & 1) + iVar18 * 2;
            uVar8 = uVar8 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar8 = iVar18 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 8;
        }
        else {
          uVar8 = bVar2 | 0x100;
          iVar18 = 0;
          iVar10 = -9;
          do {
            iVar18 = (uVar8 & 1) + iVar18 * 2;
            uVar8 = uVar8 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar8 = iVar18 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 9;
        }
        uStack_20084 = uStack_20084 | uVar8;
        iVar10 = 1;
        puVar6 = puStack_20070;
LAB_001cb164:
        puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        uVar12 = extraout_RDX_01;
      }
      else {
        uVar8 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar8 = (uVar8 >> 5) + uVar8;
        uVar8 = uVar8 * 0x10 ^ uVar8;
        uVar8 = (uVar8 >> 0x11) + uVar8;
        pvVar20 = apvStack_20038[(uVar8 >> 6) + uVar8 & 0x3fff];
        if ((pvVar20 != (void *)0x0) && (0 < (long)*(int *)((long)pvVar20 + -4))) {
          uVar13 = ~(uint)uStack_20058;
          uVar8 = (uVar13 + iVar11) - 1;
          if (0x100 < uVar8) {
            uVar8 = 0x101;
          }
          lVar14 = 0;
          do {
            lVar3 = *(long *)((long)pvVar20 + lVar14 * 8);
            if ((long)(int)((uint)uStack_20058 - 0x7fff) < lVar3 - (long)data) {
              uVar17 = 0;
              if (0 < (int)(uVar13 + iVar11)) {
                do {
                  if (*(byte *)(lVar3 + uVar17) != pbVar1[uVar17 + 1]) goto LAB_001caf6b;
                  uVar17 = uVar17 + 1;
                } while (uVar8 + 1 != uVar17);
                uVar17 = (ulong)(uVar8 + 1);
              }
LAB_001caf6b:
              if (iVar10 < (int)uVar17) goto LAB_001cafde;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != *(int *)((long)pvVar20 + -4));
        }
        iVar18 = (int)pbVar1 - (int)lVar21;
        if ((0x7fff < iVar18) || (0x102 < iVar10)) {
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image_write/stb_image_write.h"
                        ,0x304,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar17 = 0;
        do {
          uVar15 = uVar17;
          uVar17 = uVar15 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar15 + 1] <= iVar10);
        if (uVar15 < 0x17) {
          iVar11 = 0;
          iVar9 = -7;
          do {
            iVar11 = ((uint)uVar17 & 1) + iVar11 * 2;
            uVar17 = (ulong)((uint)uVar17 >> 1);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar8 = iVar11 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 7;
        }
        else {
          uVar8 = (int)uVar17 + 0xa8;
          iVar11 = 0;
          iVar9 = -8;
          do {
            iVar11 = (uVar8 & 1) + iVar11 * 2;
            uVar8 = uVar8 >> 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar8 = iVar11 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 8;
        }
        uStack_20084 = uStack_20084 | uVar8;
        puVar6 = stbiw__zlib_flushf(puStack_20070,&uStack_20084,&iStack_20088);
        uVar15 = uVar15 & 0xffffffff;
        if (0xffffffffffffffeb < uVar15 - 0x1c) {
          uStack_20084 = uStack_20084 |
                         iVar10 - (uint)stbi_zlib_compress::lengthc[uVar15] <<
                         ((byte)iStack_20088 & 0x1f);
          iStack_20088 = (uint)""[uVar15] + iStack_20088;
          puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        }
        uVar17 = 0xffffffffffffffff;
        do {
          lVar21 = uVar17 + 2;
          uVar17 = uVar17 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar21] <= iVar18);
        iVar11 = 0;
        iVar9 = -5;
        uVar15 = uVar17 & 0xffffffff;
        do {
          iVar11 = ((uint)uVar15 & 1) + iVar11 * 2;
          uVar15 = uVar15 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uStack_20084 = uStack_20084 | iVar11 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 5;
        puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        iVar11 = (int)uStack_20078;
        uVar12 = extraout_RDX_00;
        if (3 < uVar17) {
          uStack_20084 = uStack_20084 |
                         iVar18 - (uint)stbi_zlib_compress::distc[uVar17 & 0xffffffff] <<
                         ((byte)iStack_20088 & 0x1f);
          iStack_20088 = (uint)""[uVar17 & 0xffffffff] + iStack_20088;
          goto LAB_001cb164;
        }
      }
      uVar8 = iVar10 + (int)uStack_20058;
      uVar17 = (ulong)uVar8;
    } while ((int)uVar8 < iStack_20064);
  }
  if ((int)uVar8 < iVar11) {
    lVar21 = (long)(int)uVar8;
    puStack_20080 = puVar6;
    do {
      bVar7 = data[lVar21];
      if (bVar7 < 0x90) {
        uVar8 = bVar7 + 0x30;
        iVar18 = 0;
        iVar10 = -8;
        do {
          iVar18 = (uVar8 & 1) + iVar18 * 2;
          uVar8 = uVar8 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        uVar8 = iVar18 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 8;
      }
      else {
        uVar8 = bVar7 | 0x100;
        iVar18 = 0;
        iVar10 = -9;
        do {
          iVar18 = (uVar8 & 1) + iVar18 * 2;
          uVar8 = uVar8 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        uVar8 = iVar18 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 9;
      }
      uStack_20084 = uStack_20084 | uVar8;
      puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
      lVar21 = lVar21 + 1;
    } while ((int)lVar21 != iVar11);
  }
  iStack_20088 = iStack_20088 + 7;
  puStack_20080 = puVar6;
  puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
  uVar12 = extraout_RDX_02;
  if (iStack_20088 != 0) {
    do {
      iStack_20088 = iStack_20088 + 1;
      puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
      uVar12 = extraout_RDX_03;
    } while (iStack_20088 != 0);
  }
  uVar17 = uStack_20078;
  lVar21 = 0;
  puStack_20080 = puVar6;
  do {
    if (apvStack_20038[lVar21] != (void *)0x0) {
      free((void *)((long)apvStack_20038[lVar21] + -8));
      uVar12 = extraout_RDX_04;
    }
    uVar8 = (uint)uVar12;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x4000);
  iVar11 = (int)uVar17;
  if (iVar11 < 1) {
    uVar13 = 0;
    uVar19 = 1;
  }
  else {
    uVar5 = iVar11 + (int)((uVar17 & 0xffffffff) / 0x15b0) * -0x15b0;
    uVar19 = 1;
    uVar13 = 0;
    uVar17 = 0;
    do {
      if (uVar5 != 0) {
        uVar15 = 0;
        do {
          uVar19 = uVar19 + data[uVar15 + uVar17];
          uVar13 = uVar13 + uVar19;
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
        uVar19 = uVar19 % 0xfff1;
        uVar13 = uVar13 % 0xfff1;
      }
      uVar8 = (int)uVar17 + uVar5;
      uVar17 = (ulong)uVar8;
      uVar5 = 0x15b0;
    } while ((int)uVar8 < iVar11);
  }
  if (puVar6 != (uchar *)0x0) {
    iVar18 = *(int *)(puVar6 + -4);
    iVar11 = iVar18 + 1;
    if (iVar11 < *(int *)(puVar6 + -8)) goto LAB_001cb33b;
  }
  stbiw__sbgrowf(&puStack_20080,1,uVar8);
  iVar18 = *(int *)(puStack_20080 + -4);
  iVar11 = iVar18 + 1;
  puVar6 = puStack_20080;
  uVar8 = extraout_EDX_00;
LAB_001cb33b:
  *(int *)(puVar6 + -4) = iVar11;
  puVar6[iVar18] = (uchar)(uVar13 >> 8);
  if (*(int *)(puVar6 + -8) <= *(int *)(puVar6 + -4) + 1) {
    stbiw__sbgrowf(&puStack_20080,1,uVar8);
    uVar8 = extraout_EDX_01;
  }
  iVar11 = *(int *)(puStack_20080 + -4);
  *(int *)(puStack_20080 + -4) = iVar11 + 1;
  puStack_20080[iVar11] = (uchar)uVar13;
  iVar18 = *(int *)(puStack_20080 + -4);
  iVar11 = iVar18 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar11) {
    stbiw__sbgrowf(&puStack_20080,1,uVar8);
    iVar18 = *(int *)(puStack_20080 + -4);
    iVar11 = iVar18 + 1;
    uVar8 = extraout_EDX_02;
  }
  *(int *)(puStack_20080 + -4) = iVar11;
  puStack_20080[iVar18] = (uchar)(uVar19 >> 8);
  iVar18 = *(int *)(puStack_20080 + -4);
  iVar11 = iVar18 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar11) {
    stbiw__sbgrowf(&puStack_20080,1,uVar8);
    iVar18 = *(int *)(puStack_20080 + -4);
    iVar11 = iVar18 + 1;
  }
  *(int *)(puStack_20080 + -4) = iVar11;
  puStack_20080[iVar18] = (uchar)uVar19;
  iVar11 = *(int *)(puStack_20080 + -4);
  *piStack_20050 = iVar11;
  puVar6 = (uchar *)memmove(puStack_20080 + -8,puStack_20080,(long)iVar11);
  return puVar6;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}